

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O0

ParameterError data_urlencode(GlobalConfig *global,char *nextarg,char **postp,size_t *lenp)

{
  int iVar1;
  CURLcode CVar2;
  char *url;
  undefined1 local_98 [8];
  dynbuf dyn;
  char *n;
  char *enc;
  FILE *file;
  size_t size;
  char *postdata;
  size_t sStack_48;
  char is_file;
  size_t nlen;
  char *p;
  size_t *psStack_30;
  ParameterError err;
  size_t *lenp_local;
  char **postp_local;
  char *nextarg_local;
  GlobalConfig *global_local;
  
  psStack_30 = lenp;
  lenp_local = (size_t *)postp;
  postp_local = (char **)nextarg;
  nextarg_local = (char *)global;
  nlen = (size_t)strchr(nextarg,0x3d);
  size = 0;
  file = (FILE *)0x0;
  if ((char *)nlen == (char *)0x0) {
    nlen = (size_t)strchr((char *)postp_local,0x40);
  }
  if (nlen == 0) {
    sStack_48 = 0;
    postdata._7_1_ = '\0';
    nlen = (size_t)postp_local;
  }
  else {
    sStack_48 = nlen - (long)postp_local;
    postdata._7_1_ = *(char *)nlen;
    nlen = nlen + 1;
  }
  if (postdata._7_1_ == '@') {
    iVar1 = strcmp("-",(char *)nlen);
    if (iVar1 == 0) {
      enc = _stdin;
    }
    else {
      enc = (char *)fopen64((char *)nlen,"rb");
      if ((FILE *)enc == (FILE *)0x0) {
        errorf((GlobalConfig *)nextarg_local,"Failed to open %s",nlen);
        return PARAM_READ_ERROR;
      }
    }
    p._4_4_ = file2memory((char **)&size,(size_t *)&file,(FILE *)enc);
    if ((enc != (char *)0x0) && (enc != _stdin)) {
      fclose((FILE *)enc);
    }
    if (p._4_4_ != PARAM_OK) {
      return p._4_4_;
    }
  }
  else {
    p._4_4_ = getstr((char **)&size,(char *)nlen,true);
    if (p._4_4_ != PARAM_OK) {
      return p._4_4_;
    }
    file = (FILE *)strlen((char *)size);
  }
  if (size == 0) {
    size = (size_t)strdup("");
    if ((char *)size == (char *)0x0) {
      return PARAM_NO_MEM;
    }
    file = (FILE *)0x0;
  }
  else {
    url = (char *)curl_easy_escape(0,size,(ulong)file & 0xffffffff);
    free((void *)size);
    size = 0;
    if (url == (char *)0x0) {
      return PARAM_NO_MEM;
    }
    replace_url_encoded_space_by_plus(url);
    if (sStack_48 == 0) {
      dyn.toobig = (size_t)url;
      file = (FILE *)strlen(url);
    }
    else {
      curlx_dyn_init((dynbuf *)local_98,0x1f400000);
      CVar2 = curlx_dyn_addn((dynbuf *)local_98,postp_local,sStack_48);
      if (((CVar2 != CURLE_OK) ||
          (CVar2 = curlx_dyn_addn((dynbuf *)local_98,"=",1), CVar2 != CURLE_OK)) ||
         (CVar2 = curlx_dyn_add((dynbuf *)local_98,url), CVar2 != CURLE_OK)) {
        curl_free(url);
        return PARAM_NO_MEM;
      }
      curl_free(url);
      dyn.toobig = (size_t)curlx_dyn_ptr((dynbuf *)local_98);
      file = (FILE *)curlx_dyn_len((dynbuf *)local_98);
    }
    size = dyn.toobig;
  }
  *lenp_local = size;
  *psStack_30 = (size_t)file;
  return PARAM_OK;
}

Assistant:

static ParameterError data_urlencode(struct GlobalConfig *global,
                                     const char *nextarg,
                                     char **postp,
                                     size_t *lenp)
{
  /* [name]=[content], we encode the content part only
   * [name]@[filename]
   *
   * Case 2: we first load the file using that name and then encode
   * the content.
   */
  ParameterError err;
  const char *p = strchr(nextarg, '=');
  size_t nlen;
  char is_file;
  char *postdata = NULL;
  size_t size = 0;
  if(!p)
    /* there was no '=' letter, check for a '@' instead */
    p = strchr(nextarg, '@');
  if(p) {
    nlen = p - nextarg; /* length of the name part */
    is_file = *p++; /* pass the separator */
  }
  else {
    /* neither @ nor =, so no name and it is not a file */
    nlen = 0;
    is_file = 0;
    p = nextarg;
  }
  if('@' == is_file) {
    FILE *file;
    /* a '@' letter, it means that a filename or - (stdin) follows */
    if(!strcmp("-", p)) {
      file = stdin;
      CURL_SET_BINMODE(stdin);
    }
    else {
      file = fopen(p, "rb");
      if(!file) {
        errorf(global, "Failed to open %s", p);
        return PARAM_READ_ERROR;
      }
    }

    err = file2memory(&postdata, &size, file);

    if(file && (file != stdin))
      fclose(file);
    if(err)
      return err;
  }
  else {
    err = getstr(&postdata, p, ALLOW_BLANK);
    if(err)
      goto error;
    size = strlen(postdata);
  }

  if(!postdata) {
    /* no data from the file, point to a zero byte string to make this
       get sent as a POST anyway */
    postdata = strdup("");
    if(!postdata)
      return PARAM_NO_MEM;
    size = 0;
  }
  else {
    char *enc = curl_easy_escape(NULL, postdata, (int)size);
    curlx_safefree(postdata); /* no matter if it worked or not */
    if(enc) {
      char *n;
      replace_url_encoded_space_by_plus(enc);
      if(nlen > 0) { /* only append '=' if we have a name */
        struct curlx_dynbuf dyn;
        curlx_dyn_init(&dyn, MAX_DATAURLENCODE);
        if(curlx_dyn_addn(&dyn, nextarg, nlen) ||
           curlx_dyn_addn(&dyn, "=", 1) ||
           curlx_dyn_add(&dyn, enc)) {
          curl_free(enc);
          return PARAM_NO_MEM;
        }
        curl_free(enc);
        n = curlx_dyn_ptr(&dyn);
        size = curlx_dyn_len(&dyn);
      }
      else {
        n = enc;
        size = strlen(n);
      }
      postdata = n;
    }
    else
      return PARAM_NO_MEM;
  }
  *postp = postdata;
  *lenp = size;
  return PARAM_OK;
error:
  return err;
}